

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O0

void __thiscall CppGenerator::genDataHandler(CppGenerator *this)

{
  ulong uVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  ostream *this_00;
  element_type *this_01;
  size_t sVar3;
  size_t relID;
  ofstream ofs;
  CppGenerator *in_stack_00000298;
  string header;
  size_t in_stack_fffffffffffff678;
  TreeDecomposition *in_stack_fffffffffffff680;
  TDNode *in_stack_fffffffffffff688;
  char *in_stack_fffffffffffff6a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff6a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff6b0;
  CppGenerator *in_stack_fffffffffffff6b8;
  string local_920 [32];
  string local_900 [32];
  string local_8e0 [32];
  string local_8c0 [32];
  string local_8a0 [32];
  string local_880 [32];
  ulong local_860;
  string local_858 [32];
  string local_838 [32];
  string local_818 [32];
  ostream local_7f8 [128];
  CppGenerator *in_stack_fffffffffffff888;
  string local_5f8 [32];
  string local_5d8 [32];
  string local_5b8 [32];
  string local_598 [32];
  string local_578 [39];
  undefined1 local_551 [33];
  string local_530 [32];
  string local_510 [32];
  string local_4f0 [32];
  string local_4d0 [39];
  allocator local_4a9;
  string local_4a8 [32];
  string local_488 [32];
  string local_468 [32];
  string local_448 [32];
  string local_428 [32];
  string local_408 [32];
  string local_3e8 [32];
  string local_3c8 [39];
  allocator local_3a1;
  string local_3a0 [32];
  string local_380 [32];
  string local_360 [32];
  string local_340 [32];
  string local_320 [32];
  string local_300 [32];
  string local_2e0 [32];
  string local_2c0 [32];
  string local_2a0 [32];
  string local_280 [32];
  string local_260 [32];
  string local_240 [32];
  string local_220 [32];
  string local_200 [32];
  string local_1e0 [32];
  string local_1c0 [32];
  string local_1a0 [32];
  string local_180 [24];
  CppGenerator *in_stack_fffffffffffffe98;
  allocator local_149;
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_148,"#ifndef INCLUDE_DATAHANDLER_HPP_\n",&local_149);
  std::operator+(&in_stack_fffffffffffff688->_name,(char *)in_stack_fffffffffffff680);
  std::operator+(&in_stack_fffffffffffff688->_name,(char *)in_stack_fffffffffffff680);
  std::operator+(&in_stack_fffffffffffff688->_name,(char *)in_stack_fffffffffffff680);
  std::operator+(&in_stack_fffffffffffff688->_name,(char *)in_stack_fffffffffffff680);
  std::operator+(&in_stack_fffffffffffff688->_name,(char *)in_stack_fffffffffffff680);
  std::operator+(&in_stack_fffffffffffff688->_name,(char *)in_stack_fffffffffffff680);
  std::operator+(&in_stack_fffffffffffff688->_name,(char *)in_stack_fffffffffffff680);
  std::operator+(&in_stack_fffffffffffff688->_name,(char *)in_stack_fffffffffffff680);
  std::operator+(&in_stack_fffffffffffff688->_name,(char *)in_stack_fffffffffffff680);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::~string(local_e8);
  std::__cxx11::string::~string(local_108);
  std::__cxx11::string::~string(local_128);
  std::__cxx11::string::~string(local_148);
  std::allocator<char>::~allocator((allocator<char> *)&local_149);
  if ((multifaq::cppgen::MICRO_BENCH & 1) != 0) {
    offset_abi_cxx11_(in_stack_fffffffffffff6b8,(size_t)in_stack_fffffffffffff6b0);
    std::operator+((char *)in_stack_fffffffffffff688,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff680);
    std::operator+(&in_stack_fffffffffffff688->_name,(char *)in_stack_fffffffffffff680);
    offset_abi_cxx11_(in_stack_fffffffffffff6b8,(size_t)in_stack_fffffffffffff6b0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff6b8,in_stack_fffffffffffff6b0);
    std::operator+(&in_stack_fffffffffffff688->_name,(char *)in_stack_fffffffffffff680);
    offset_abi_cxx11_(in_stack_fffffffffffff6b8,(size_t)in_stack_fffffffffffff6b0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff6b8,in_stack_fffffffffffff6b0);
    std::operator+(&in_stack_fffffffffffff688->_name,(char *)in_stack_fffffffffffff680);
    std::operator+(&in_stack_fffffffffffff688->_name,(char *)in_stack_fffffffffffff680);
    offset_abi_cxx11_(in_stack_fffffffffffff6b8,(size_t)in_stack_fffffffffffff6b0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff6b8,in_stack_fffffffffffff6b0);
    std::operator+(&in_stack_fffffffffffff688->_name,(char *)in_stack_fffffffffffff680);
    offset_abi_cxx11_(in_stack_fffffffffffff6b8,(size_t)in_stack_fffffffffffff6b0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff6b8,in_stack_fffffffffffff6b0);
    std::operator+(&in_stack_fffffffffffff688->_name,(char *)in_stack_fffffffffffff680);
    std::__cxx11::string::operator+=(local_28,local_180);
    std::__cxx11::string::~string(local_180);
    std::__cxx11::string::~string(local_1a0);
    std::__cxx11::string::~string(local_360);
    std::__cxx11::string::~string(local_1c0);
    std::__cxx11::string::~string(local_1e0);
    std::__cxx11::string::~string(local_340);
    std::__cxx11::string::~string(local_200);
    std::__cxx11::string::~string(local_220);
    std::__cxx11::string::~string(local_240);
    std::__cxx11::string::~string(local_320);
    std::__cxx11::string::~string(local_260);
    std::__cxx11::string::~string(local_280);
    std::__cxx11::string::~string(local_300);
    std::__cxx11::string::~string(local_2a0);
    std::__cxx11::string::~string(local_2c0);
    std::__cxx11::string::~string(local_2e0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_3a0,"#define BEGIN_MICRO_BENCH(timer) begin_##timer = ",&local_3a1);
    std::operator+(&in_stack_fffffffffffff688->_name,(char *)in_stack_fffffffffffff680);
    std::__cxx11::string::operator+=(local_28,local_380);
    std::__cxx11::string::~string(local_380);
    std::__cxx11::string::~string(local_3a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_4a8,"#define END_MICRO_BENCH(timer) finish_##timer = ",&local_4a9);
    std::operator+(&in_stack_fffffffffffff688->_name,(char *)in_stack_fffffffffffff680);
    offset_abi_cxx11_(in_stack_fffffffffffff6b8,(size_t)in_stack_fffffffffffff6b0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff6b8,in_stack_fffffffffffff6b0);
    std::operator+(&in_stack_fffffffffffff688->_name,(char *)in_stack_fffffffffffff680);
    offset_abi_cxx11_(in_stack_fffffffffffff6b8,(size_t)in_stack_fffffffffffff6b0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff6b8,in_stack_fffffffffffff6b0);
    std::operator+(&in_stack_fffffffffffff688->_name,(char *)in_stack_fffffffffffff680);
    offset_abi_cxx11_(in_stack_fffffffffffff6b8,(size_t)in_stack_fffffffffffff6b0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff6b8,in_stack_fffffffffffff6b0);
    std::operator+(&in_stack_fffffffffffff688->_name,(char *)in_stack_fffffffffffff680);
    std::__cxx11::string::operator+=(local_28,local_3c8);
    std::__cxx11::string::~string(local_3c8);
    std::__cxx11::string::~string(local_3e8);
    std::__cxx11::string::~string(local_510);
    std::__cxx11::string::~string(local_408);
    std::__cxx11::string::~string(local_428);
    std::__cxx11::string::~string(local_4f0);
    std::__cxx11::string::~string(local_448);
    std::__cxx11::string::~string(local_468);
    std::__cxx11::string::~string(local_4d0);
    std::__cxx11::string::~string(local_488);
    std::__cxx11::string::~string(local_4a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_4a9);
    in_stack_fffffffffffff6b8 = (CppGenerator *)local_551;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_551 + 1),"#define PRINT_MICRO_BENCH(timer) std::cout << ",
               (allocator *)in_stack_fffffffffffff6b8);
    std::operator+(&in_stack_fffffffffffff688->_name,(char *)in_stack_fffffffffffff680);
    std::__cxx11::string::operator+=(local_28,local_530);
    std::__cxx11::string::~string(local_530);
    std::__cxx11::string::~string((string *)(local_551 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_551);
  }
  offset_abi_cxx11_(in_stack_fffffffffffff6b8,(size_t)in_stack_fffffffffffff6b0);
  std::operator+((char *)in_stack_fffffffffffff688,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff680);
  std::operator+(&in_stack_fffffffffffff688->_name,(char *)in_stack_fffffffffffff680);
  std::operator+(&in_stack_fffffffffffff688->_name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff680);
  std::operator+(&in_stack_fffffffffffff688->_name,(char *)in_stack_fffffffffffff680);
  std::__cxx11::string::operator+=(local_28,local_578);
  std::__cxx11::string::~string(local_578);
  std::__cxx11::string::~string(local_598);
  std::__cxx11::string::~string(local_5b8);
  std::__cxx11::string::~string(local_5d8);
  std::__cxx11::string::~string(local_5f8);
  std::operator+(in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a0);
  std::ofstream::ofstream(local_7f8,local_818,_S_out);
  std::__cxx11::string::~string(local_818);
  poVar2 = std::operator<<(local_7f8,local_28);
  genTupleStructs_abi_cxx11_(in_stack_00000298);
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::operator<<(poVar2,local_838);
  genCaseIdentifiers_abi_cxx11_(in_stack_fffffffffffff888);
  this_00 = std::operator<<((ostream *)__lhs,local_858);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_858);
  std::__cxx11::string::~string(local_838);
  local_860 = 0;
  while( true ) {
    uVar1 = local_860;
    this_01 = std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x284aa5);
    sVar3 = TreeDecomposition::numberOfRelations(this_01);
    if (sVar3 <= uVar1) break;
    offset_abi_cxx11_(in_stack_fffffffffffff6b8,(size_t)poVar2);
    std::operator+(&in_stack_fffffffffffff688->_name,(char *)in_stack_fffffffffffff680);
    std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x284b0c);
    in_stack_fffffffffffff688 =
         TreeDecomposition::getRelation(in_stack_fffffffffffff680,in_stack_fffffffffffff678);
    std::operator+(&in_stack_fffffffffffff688->_name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff680);
    std::operator+(&in_stack_fffffffffffff688->_name,(char *)in_stack_fffffffffffff680);
    std::operator<<(local_7f8,local_880);
    std::__cxx11::string::~string(local_880);
    std::__cxx11::string::~string(local_8a0);
    std::__cxx11::string::~string(local_8c0);
    std::__cxx11::string::~string(local_8e0);
    local_860 = local_860 + 1;
  }
  std::operator<<(local_7f8,"}\n\n#endif /* INCLUDE_DATAHANDLER_HPP_*/\n");
  std::ofstream::close();
  std::operator+(__lhs,(char *)this_00);
  std::ofstream::open((string *)local_7f8,(_Ios_Openmode)local_900);
  std::__cxx11::string::~string(local_900);
  genTupleStructConstructors_abi_cxx11_(in_stack_fffffffffffffe98);
  poVar2 = std::operator<<(local_7f8,local_920);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_920);
  std::ofstream::close();
  std::ofstream::~ofstream(local_7f8);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void CppGenerator::genDataHandler()
{
    std::string header = std::string("#ifndef INCLUDE_DATAHANDLER_HPP_\n")+
        "#define INCLUDE_DATAHANDLER_HPP_\n\n"+
        "#include <algorithm>\n"+
        "#include <chrono>\n"+
        "#include <cstring>\n"+
        "#include <fstream>\n"+
        "#include <iostream>\n" +
        "#include <thread>\n" +
        "#include <unordered_map>\n" +
        "#include <vector>\n\n";

#if defined(__GNUC__) && defined(NDEBUG) && !defined(__clang__)
    header += "#include <parallel/algorithm>\n";
#endif

    if (MICRO_BENCH)
    {
        header += "#define INIT_MICRO_BENCH(timer)\\\n"+offset(1)+
            "auto begin_##timer = std::chrono::high_resolution_clock::now();\\\n"+
            offset(1)+
            "auto finish_##timer = std::chrono::high_resolution_clock::now();\\\n"+
            offset(1)+"std::chrono::duration<double>  elapsed_##timer = "+
            "finish_##timer - begin_##timer;\\\n"+
            offset(1)+"double time_spent_##timer = elapsed_##timer.count();\\\n"+
            offset(1)+"double global_time_##timer = 0;\n";

        header += std::string("#define BEGIN_MICRO_BENCH(timer) begin_##timer = ")+
            "std::chrono::high_resolution_clock::now();\n";
        header += std::string("#define END_MICRO_BENCH(timer) finish_##timer = ")+
            "std::chrono::high_resolution_clock::now();\\\n"+
            offset(1)+"elapsed_##timer = finish_##timer - begin_##timer;\\\n"+
            offset(1)+"time_spent_##timer = elapsed_##timer.count();\\\n"+
            offset(1)+"global_time_##timer += time_spent_##timer;\n";

        header += std::string("#define PRINT_MICRO_BENCH(timer) std::cout << ")+
            "#timer << \": \" << std::to_string(global_time_##timer) << std::endl;\n\n";
    }
    
    header += "using namespace std::chrono;\n\nnamespace lmfao\n{\n"+
        offset(1)+"const std::string PATH_TO_DATA = \""+PATH_TO_DATA+"\";\n\n";

    std::ofstream ofs(multifaq::dir::OUTPUT_DIRECTORY+"DataHandler.h", std::ofstream::out);

    ofs << header << genTupleStructs() << genCaseIdentifiers() << std::endl;

    for (size_t relID = 0; relID < _td->numberOfRelations(); ++relID)
        ofs << offset(1)+"extern void sort"+_td->getRelation(relID)->_name+"();\n";
    
    ofs <<  "}\n\n#endif /* INCLUDE_DATAHANDLER_HPP_*/\n";    
    ofs.close();

    ofs.open(multifaq::dir::OUTPUT_DIRECTORY+"DataHandler.cpp", std::ofstream::out);
    ofs << genTupleStructConstructors() << std::endl;
    ofs.close();
}